

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O2

WebAssemblyTable * __thiscall
Js::WebAssemblyEnvironment::GetVarElement<Js::WebAssemblyTable>
          (WebAssemblyEnvironment *this,Type *ptr,uint32 index,uint32 maxCount)

{
  Var aValue;
  bool bVar1;
  WebAssemblyTable *pWVar2;
  
  if (index < maxCount) {
    CheckPtrIsValid<Js::WebAssemblyTable*>(this,(intptr_t)(ptr + index));
    aValue = ptr[index].ptr;
    if (aValue == (Var)0x0) {
      return (WebAssemblyTable *)0x0;
    }
    bVar1 = VarIs<Js::WebAssemblyTable>(aValue);
    if (bVar1) {
      pWVar2 = VarTo<Js::WebAssemblyTable>(aValue);
      return pWVar2;
    }
  }
  Throw::InternalError();
}

Assistant:

T* WebAssemblyEnvironment::GetVarElement(Field(Var)* ptr, uint32 index, uint32 maxCount) const
{
    if (index >= maxCount)
    {
        Js::Throw::InternalError();
    }

    Field(Var)* functionPtr = ptr + index;
    CheckPtrIsValid<T*>((intptr_t)functionPtr);
    Var varFunc = *functionPtr;
    if (varFunc)
    {
        if (!VarIs<T>(varFunc))
        {
            Js::Throw::InternalError();
        }
        return VarTo<T>(varFunc);
    }
    return nullptr;
}